

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_aligned.cc
# Opt level: O0

void runOnce<long,disruptor::MultiThreadedStrategyEx,disruptor::SleepingStrategy<200l,std::chrono::duration<long,std::ratio<1l,1000l>>,1>>
               (void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ostream *poVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  rep rVar8;
  ulong uVar9;
  type diff;
  time_point end_time;
  int64_t cursor;
  int i_4;
  int i_3;
  int i_2;
  time_point start_time;
  thread *tp;
  int i_1;
  thread *tc;
  int i;
  Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_64>
  s;
  vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> seqs;
  Sequence *sequences;
  memory_order __b_1;
  memory_order __b;
  Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_64>
  *in_stack_fffffffffffffac0;
  Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_64>
  *in_stack_fffffffffffffac8;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffffad0;
  vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *this;
  size_t in_stack_fffffffffffffae0;
  ulong *puVar10;
  Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_64>
  *in_stack_fffffffffffffae8;
  ulong *puVar11;
  reference_wrapper<disruptor::Sequence> *in_stack_fffffffffffffaf0;
  reference_wrapper<disruptor::Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_64>_>
  *in_stack_fffffffffffffaf8;
  ulong *puVar12;
  _func_void_Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_64>_ptr_Sequence_ptr
  *in_stack_fffffffffffffb00;
  thread *in_stack_fffffffffffffb08;
  char *in_stack_fffffffffffffb20;
  ulong *local_3d8;
  ulong *local_3a8;
  vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *local_378;
  duration<long,_std::ratio<1L,_1000L>_> local_350;
  duration<long,_std::ratio<1L,_1000L>_> local_348;
  string local_340 [32];
  string local_320 [32];
  rep local_300;
  undefined8 local_2f8;
  int64_t local_2f0;
  int local_2e8;
  int local_2e4;
  Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_64>
  *local_2e0;
  int local_2cc;
  undefined8 local_2c8;
  ulong *local_2c0;
  Sequence *local_2b8;
  Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_64>
  *local_2b0;
  int local_29c;
  ulong *local_298;
  vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *local_290;
  int local_284;
  vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *local_90;
  __atomic_base<long> local_88;
  memory_order local_80;
  undefined4 local_7c;
  atomic<long> *local_78;
  __int_type local_70;
  memory_order local_68;
  int local_64;
  __atomic_base<long> local_60;
  atomic<long> *local_58;
  
  poVar4 = std::operator<<((ostream *)&std::cout,"Staring run ");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  local_58 = &sum;
  local_60._M_i = 0;
  local_64 = 5;
  local_68 = std::operator&(memory_order_seq_cst,__memory_order_mask);
  local_70 = local_60._M_i;
  if ((local_64 != 3) && (local_64 == 5)) {
    LOCK();
    UNLOCK();
  }
  sum.super___atomic_base<long>._M_i = (__atomic_base<long>)(__atomic_base<long>)local_60._M_i;
  uVar5 = (ulong)nc;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar5;
  uVar6 = SUB168(auVar1 * ZEXT816(0x78),0);
  if (SUB168(auVar1 * ZEXT816(0x78),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  local_90 = (vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *)
             operator_new__(uVar6);
  if (uVar5 != 0) {
    local_378 = local_90;
    do {
      disruptor::Sequence::Sequence
                ((Sequence *)in_stack_fffffffffffffac8,(int64_t)in_stack_fffffffffffffac0);
      local_378 = local_378 + 5;
    } while (local_378 != local_90 + uVar5 * 5);
  }
  std::vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>::vector
            ((vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *)0x1697ee);
  disruptor::
  Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_64>
  ::Sequencer(in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
  for (local_284 = 0; local_284 < nc; local_284 = local_284 + 1) {
    local_290 = local_90 + (long)local_284 * 5;
    std::vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>::push_back
              ((vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *)
               in_stack_fffffffffffffac8,(value_type *)in_stack_fffffffffffffac0);
  }
  disruptor::
  Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_64>
  ::set_gating_sequences
            (in_stack_fffffffffffffac8,
             (vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *)
             in_stack_fffffffffffffac0);
  uVar5 = (ulong)nc;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar5;
  uVar6 = SUB168(auVar2 * ZEXT816(8),0);
  uVar9 = uVar6 + 8;
  if (0xfffffffffffffff7 < uVar6) {
    uVar9 = 0xffffffffffffffff;
  }
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  local_298 = (ulong *)operator_new__(uVar9);
  *local_298 = uVar5;
  local_298 = local_298 + 1;
  if (uVar5 != 0) {
    local_3a8 = local_298;
    do {
      std::thread::thread((thread *)0x169981);
      local_3a8 = local_3a8 + 1;
    } while (local_3a8 != local_298 + uVar5);
  }
  for (local_29c = 0; local_29c < nc; local_29c = local_29c + 1) {
    local_2b0 = (Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_64>
                 *)std::
                   ref<disruptor::Sequencer<long,disruptor::MultiThreadedStrategyEx,disruptor::SleepingStrategy<200l,std::chrono::duration<long,std::ratio<1l,1000l>>,1>,64>>
                             (in_stack_fffffffffffffac0);
    local_2b8 = (Sequence *)std::ref<disruptor::Sequence>((Sequence *)in_stack_fffffffffffffac0);
    std::thread::
    thread<void(&)(disruptor::Sequencer<long,disruptor::MultiThreadedStrategyEx,disruptor::SleepingStrategy<200l,std::chrono::duration<long,std::ratio<1l,1000l>>,1>,64>&,disruptor::Sequence&),std::reference_wrapper<disruptor::Sequencer<long,disruptor::MultiThreadedStrategyEx,disruptor::SleepingStrategy<200l,std::chrono::duration<long,std::ratio<1l,1000l>>,1>,64>>,std::reference_wrapper<disruptor::Sequence>,void>
              (in_stack_fffffffffffffb08,in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,
               in_stack_fffffffffffffaf0);
    std::thread::operator=((thread *)in_stack_fffffffffffffac8,(thread *)in_stack_fffffffffffffac0);
    std::thread::~thread((thread *)0x169a60);
  }
  uVar5 = (ulong)np;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar5;
  uVar6 = SUB168(auVar3 * ZEXT816(8),0);
  uVar9 = uVar6 + 8;
  if (0xfffffffffffffff7 < uVar6) {
    uVar9 = 0xffffffffffffffff;
  }
  if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  local_2c0 = (ulong *)operator_new__(uVar9);
  *local_2c0 = uVar5;
  local_2c0 = local_2c0 + 1;
  if (uVar5 != 0) {
    local_3d8 = local_2c0;
    do {
      std::thread::thread((thread *)0x169b1b);
      local_3d8 = local_3d8 + 1;
    } while (local_3d8 != local_2c0 + uVar5);
  }
  local_2c8 = std::chrono::_V2::system_clock::now();
  for (local_2cc = 0; local_2cc < np; local_2cc = local_2cc + 1) {
    local_2e0 = (Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_64>
                 *)std::
                   ref<disruptor::Sequencer<long,disruptor::MultiThreadedStrategyEx,disruptor::SleepingStrategy<200l,std::chrono::duration<long,std::ratio<1l,1000l>>,1>,64>>
                             (in_stack_fffffffffffffac0);
    std::thread::
    thread<void(&)(disruptor::Sequencer<long,disruptor::MultiThreadedStrategyEx,disruptor::SleepingStrategy<200l,std::chrono::duration<long,std::ratio<1l,1000l>>,1>,64>&),std::reference_wrapper<disruptor::Sequencer<long,disruptor::MultiThreadedStrategyEx,disruptor::SleepingStrategy<200l,std::chrono::duration<long,std::ratio<1l,1000l>>,1>,64>>,void>
              (in_stack_fffffffffffffb08,
               (_func_void_Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_64>_ptr
                *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
    std::thread::operator=((thread *)in_stack_fffffffffffffac8,(thread *)in_stack_fffffffffffffac0);
    std::thread::~thread((thread *)0x169bd7);
  }
  for (local_2e4 = 0; local_2e4 < np; local_2e4 = local_2e4 + 1) {
    std::thread::join();
  }
  for (local_2e8 = 0; local_2e8 < nc; local_2e8 = local_2e8 + 1) {
    std::thread::join();
  }
  local_2f0 = disruptor::
              Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_64>
              ::GetCursor((Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_64>
                           *)0x169c8e);
  poVar4 = std::operator<<((ostream *)&std::cout,"\nBatch size: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,delta);
  poVar4 = std::operator<<(poVar4," Ring buffer size: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,RING_BUFFER_SIZE);
  poVar4 = std::operator<<(poVar4," Alignment: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x40);
  std::operator<<(poVar4,'\n');
  poVar4 = std::operator<<((ostream *)&std::cout,"Cursor: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_2f0);
  std::operator<<(poVar4,'\n');
  poVar4 = std::operator<<((ostream *)&std::cout,"Sum: ");
  local_78 = &sum;
  local_7c = 5;
  local_80 = std::operator&(memory_order_seq_cst,__memory_order_mask);
  local_88 = sum.super___atomic_base<long>._M_i;
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(long)sum.super___atomic_base<long>._M_i);
  poVar4 = std::operator<<(poVar4," Expected sum: ");
  poVar4 = (ostream *)
           std::ostream::operator<<(poVar4,(expectedValue * (expectedValue + 1) * (long)nc) / 2);
  std::operator<<(poVar4,'\n');
  local_2f8 = std::chrono::_V2::system_clock::now();
  local_300 = (rep)std::chrono::operator-
                             (in_stack_fffffffffffffad0,
                              (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                               *)in_stack_fffffffffffffac8);
  poVar4 = (ostream *)std::ostream::operator<<(&std::cout,np);
  poVar4 = std::operator<<(poVar4,"P-");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,nc);
  poVar4 = std::operator<<(poVar4,"C ");
  std::type_info::name((type_info *)&disruptor::MultiThreadedStrategyEx::typeinfo);
  demangle_abi_cxx11_(in_stack_fffffffffffffb20);
  poVar4 = std::operator<<(poVar4,local_320);
  poVar4 = std::operator<<(poVar4," ");
  std::type_info::name
            ((type_info *)
             &disruptor::SleepingStrategy<200l,std::chrono::duration<long,std::ratio<1l,1000l>>,1>::
              typeinfo);
  demangle_abi_cxx11_(in_stack_fffffffffffffb20);
  poVar4 = std::operator<<(poVar4,local_340);
  std::operator<<(poVar4,'\n');
  std::__cxx11::string::~string(local_340);
  std::__cxx11::string::~string(local_320);
  lVar7 = local_2f0 * 1000;
  local_348.__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                      ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffac0);
  rVar8 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_348);
  poVar4 = (ostream *)std::ostream::operator<<(&std::cout,lVar7 / rVar8);
  poVar4 = std::operator<<(poVar4," ops/secs");
  std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<((ostream *)&std::cout,"Milliseconds: ");
  local_350.__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                      ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffac0);
  rVar8 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_350);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,rVar8);
  std::operator<<(poVar4,"\n\n");
  puVar12 = local_298;
  if (local_298 != (ulong *)0x0) {
    puVar11 = local_298 + -1;
    puVar10 = local_298 + local_298[-1];
    while (puVar12 != puVar10) {
      puVar10 = puVar10 + -1;
      std::thread::~thread((thread *)0x16a200);
    }
    operator_delete__(puVar11);
  }
  if (local_2c0 != (ulong *)0x0) {
    puVar11 = local_2c0 + -1;
    puVar10 = local_2c0 + local_2c0[-1];
    puVar12 = local_2c0;
    if (local_2c0 != puVar10) {
      do {
        puVar10 = puVar10 + -1;
        std::thread::~thread((thread *)0x16a26d);
      } while (puVar10 != puVar12);
    }
    operator_delete__(puVar11);
  }
  this = local_90;
  if (local_90 != (vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *)0x0) {
    operator_delete__(local_90);
  }
  disruptor::
  Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_64>
  ::~Sequencer(in_stack_fffffffffffffac8);
  std::vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>::~vector(this);
  return;
}

Assistant:

void runOnce() {
  std::cout << "Staring run " << std::endl;

  sum.store(0);

  disruptor::Sequence* sequences = new disruptor::Sequence[nc];

  std::vector<disruptor::Sequence*> seqs;
  disruptor::Sequencer<T, C, W, Alignment> s(RING_BUFFER_SIZE);

  for (int i = 0; i < nc; ++i) seqs.push_back(&sequences[i]);

  s.set_gating_sequences(seqs);

  std::thread* tc = new std::thread[nc];
  for (int i = 0; i < nc; ++i)
    tc[i] = std::thread(consume<T, C, W>, std::ref(s), std::ref(sequences[i]));

  std::thread* tp = new std::thread[np];

  auto start_time = std::chrono::high_resolution_clock::now();

  for (int i = 0; i < np; ++i)
    tp[i] = std::thread(produce<T, C, W>, std::ref(s));

  // std::this_thread::sleep_for(std::chrono::seconds(3));

  for (int i = 0; i < np; ++i) tp[i].join();
  for (int i = 0; i < nc; ++i) tc[i].join();

  int64_t cursor = s.GetCursor();
  std::cout << "\nBatch size: " << delta
            << " Ring buffer size: " << RING_BUFFER_SIZE
            << " Alignment: " << Alignment << '\n';
  std::cout << "Cursor: " << cursor << '\n';
  std::cout << "Sum: " << sum.load() << " Expected sum: "
            << (expectedValue * (expectedValue + 1) * nc) / 2 << '\n';

  auto end_time = std::chrono::high_resolution_clock::now();
  auto diff = end_time - start_time;

  // std::cout.precision(15);
  std::cout << np << "P-" << nc << "C " << demangle(typeid(C).name()) << " "
            << demangle(typeid(W).name()) << '\n';
  std::cout << (cursor * 1000) /
                   (std::chrono::duration_cast<std::chrono::milliseconds>(diff)
                        .count())
            << " ops/secs"
            << "\n";

  std::cout << "Milliseconds: " << std::chrono::duration_cast<std::chrono::milliseconds>(diff)
                          .count() << "\n\n";

  delete[] tc;
  delete[] tp;
  delete[] sequences;
}